

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopn.c
# Opt level: O2

UINT8 ym2203_read(void *chip,UINT8 a)

{
  UINT8 UVar1;
  YM2203 *F2203;
  
  if ((a & 1) == 0) {
    return *(UINT8 *)((long)chip + 0x12f);
  }
  if (*(byte *)((long)chip + 300) < 0x10) {
    UVar1 = (**(code **)((long)chip + 0x568))(*(undefined8 *)((long)chip + 0x578),0);
    return UVar1;
  }
  return '\0';
}

Assistant:

UINT8 ym2203_read(void *chip,UINT8 a)
{
	YM2203 *F2203 = (YM2203 *)chip;
	UINT8 addr = F2203->OPN.ST.address;
	UINT8 ret = 0;

	if( !(a&1) )
	{   /* status port */
		ret = FM_STATUS_FLAG(&F2203->OPN.ST);
	}
	else
	{   /* data port (only SSG) */
		if( addr < 16 ) ret = F2203->OPN.ST.SSG_funcs.read(F2203->OPN.ST.SSG_param, 0);
	}
	return ret;
}